

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> * __thiscall
tiger::trains::world::World::getEventsAfter
          (vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
           *__return_storage_ptr__,World *this,int startTick)

{
  pointer pvVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  ulong uVar4;
  IEvent *event;
  
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = (ulong)startTick;
  while( true ) {
    pvVar1 = (this->eventsHistory).
             super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->eventsHistory).
                       super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar4)
    break;
    ppIVar2 = *(pointer *)
               ((long)&pvVar1[uVar4].
                       super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    for (ppIVar3 = pvVar1[uVar4].
                   super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppIVar3 != ppIVar2;
        ppIVar3 = ppIVar3 + 1) {
      event = *ppIVar3;
      std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>::
      push_back(__return_storage_ptr__,&event);
    }
    uVar4 = uVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<IEvent *> World::getEventsAfter(int startTick) const
{
    std::vector<IEvent *> res;

    for (size_t i=startTick; i<eventsHistory.size(); i++)
        for (IEvent *event: eventsHistory[i])
            res.push_back(event);

    return res;
}